

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_container_unit.c
# Opt level: O1

int run_negation_range_tests
              (int k,int h,int start_offset,int r_start,int r_end,int expected_type,_Bool inplace,
              _Bool expected_actual_inplace)

{
  byte bVar1;
  rle16_t *prVar2;
  uint8_t uVar3;
  _Bool _Var4;
  int extraout_EAX;
  int extraout_EAX_00;
  run_container_t *src;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  uint8_t typecode;
  int iVar9;
  ulong uVar10;
  run_container_t *run;
  bool bVar11;
  uint uVar12;
  uint uVar13;
  int x;
  _Bool result_should_be [65536];
  run_container_t *prStack_10050;
  int iStack_10044;
  int iStack_10040;
  uint uStack_1003c;
  byte abStack_10038 [65544];
  
  iVar7 = 0;
  iStack_10044 = expected_type;
  iStack_10040 = r_start;
  uStack_1003c = r_end;
  src = run_container_create_given_capacity((int)(0x10000 / (ulong)(uint)k) + 1);
  uVar10 = (ulong)(h < k);
  _assert_true(uVar10,"h < k",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x62d);
  if (start_offset != 0x10000) {
    iVar5 = -start_offset;
    iVar9 = h;
    do {
      if (iVar7 % k == 0) {
        iVar6 = iVar9;
        if (0x10000 < start_offset + iVar7 + iVar9) {
          iVar6 = iVar5;
        }
        uVar10 = (ulong)src->n_runs;
        src->runs[uVar10] = (rle16_t)((start_offset + iVar7 & 0xffffU) + iVar6 * 0x10000 + -0x10000)
        ;
        src->n_runs = src->n_runs + 1;
        iVar9 = iVar9 + 1;
        if (iVar9 == k) {
          iVar9 = h;
        }
      }
      iVar7 = iVar7 + 1;
      iVar5 = iVar5 + -1;
    } while (iVar5 != -0x10000);
  }
  prVar2 = src->runs;
  iVar7 = src->n_runs;
  lVar8 = 0;
  iVar9 = 0;
  do {
    uVar13 = 0;
    iVar5 = iVar7 + -1;
    do {
      if (iVar5 < (int)uVar13) {
        uVar10 = (ulong)~uVar13;
        break;
      }
      uVar12 = uVar13 + iVar5 >> 1;
      if (prVar2[uVar12].value < (ushort)lVar8) {
        uVar13 = uVar12 + 1;
        bVar11 = true;
      }
      else if ((ushort)lVar8 < prVar2[uVar12].value) {
        iVar5 = uVar12 - 1;
        bVar11 = true;
      }
      else {
        bVar11 = false;
        uVar10 = (ulong)uVar12;
      }
    } while (bVar11);
    bVar11 = true;
    iVar5 = (int)uVar10;
    if ((iVar5 < 0) &&
       ((iVar5 == -1 ||
        (uVar10 = (ulong)prVar2[-iVar5 - 2U].length,
        (int)(uint)prVar2[-iVar5 - 2U].length < (int)((int)lVar8 - (uint)prVar2[-iVar5 - 2U].value))
        ))) {
      bVar11 = false;
    }
    uVar10 = CONCAT71((int7)(uVar10 >> 8),iStack_10040 <= lVar8);
    if (iStack_10040 <= lVar8 == bVar11) {
      abStack_10038[lVar8] = 0;
    }
    else {
      abStack_10038[lVar8] = 1;
      iVar9 = iVar9 + 1;
    }
    lVar8 = lVar8 + 1;
    if (lVar8 == 0x10000) {
      if ((char)iStack_10044 == '\0') {
        iVar7 = run_container_negation_range(src,iStack_10040,0x10000,&prStack_10050);
      }
      else {
        iVar7 = run_container_negation_range_inplace(src,iStack_10040,0x10000,&prStack_10050);
      }
      typecode = (uint8_t)iVar7;
      run = prStack_10050;
      uVar3 = typecode;
      if (typecode == '\x04') {
        run = *(run_container_t **)prStack_10050;
        uVar3 = *(uint8_t *)&prStack_10050->runs;
      }
      if (uVar3 == '\x03') {
        iVar5 = run_container_cardinality(run);
      }
      else {
        iVar5 = run->n_runs;
      }
      _assert_int_equal((ulong)uStack_1003c,(long)iVar7,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x653);
      _assert_true((ulong)((prStack_10050 != src) != inplace),"BO == RI",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                   ,(inplace ^ 1) * 2 + 0x656);
      _assert_int_equal((long)iVar9,(long)iVar5,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x65b);
      uVar10 = 0;
      do {
        _Var4 = container_contains(prStack_10050,(uint16_t)uVar10,typecode);
        bVar1 = abStack_10038[uVar10];
        if ((_Bool)bVar1 != _Var4) {
          printf("problem at index %d should be (but isnt) %d\n",uVar10 & 0xffffffff,
                 (ulong)(uint)bVar1);
        }
        _Var4 = container_contains(prStack_10050,(uint16_t)uVar10,typecode);
        _assert_int_equal((ulong)_Var4,(ulong)(uint)bVar1,
                          "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                          ,0x665);
        uVar10 = uVar10 + 1;
      } while (uVar10 != 0x10000);
      container_free(prStack_10050,typecode);
      iVar7 = extraout_EAX;
      if ((char)iStack_10044 == '\0') {
        run_container_free(src);
        iVar7 = extraout_EAX_00;
      }
      return iVar7;
    }
  } while( true );
}

Assistant:

static int run_negation_range_tests(int k, int h, int start_offset, int r_start,
                                    int r_end, int expected_type, bool inplace,
                                    bool expected_actual_inplace) {
    run_container_t* RI =
        run_container_create_given_capacity((1 << 16) / k + 1);
    container_t* BO;
    int returned_type;
    int result_size_should_be;
    bool result_should_be[1 << 16];

    assert_true(h <
                k);  // bad test call otherwise..not failure of code under test

    int runlen = h;
    for (int x = 0; x < (1 << 16) - start_offset; x++) {
        int offsetx = x + start_offset;
        if (x % k == 0) {
            int actual_runlen = runlen;
            if (offsetx + runlen > (1 << 16))
                actual_runlen = (1 << 16) - offsetx;

            // run_container_append does not dynamically increase its
            // array
            run_container_append_first(
                RI, CROARING_MAKE_RLE16(offsetx, actual_runlen - 1));
            if (++runlen == k) runlen = h;  // wrap after k-1 back to h.
        }
    }

    result_size_should_be = 0;

    for (int i = 0; i < (1 << 16); ++i) {
        bool in_zone = (i >= r_start && i < r_end);
        if (run_container_contains(RI, (uint16_t)i) ^ in_zone) {
            result_should_be[i] = true;
            ++result_size_should_be;
        } else
            result_should_be[i] = false;
    }
    if (inplace)
        returned_type =
            run_container_negation_range_inplace(RI, r_start, r_end, &BO);
    else
        returned_type = run_container_negation_range(RI, r_start, r_end, &BO);

    uint8_t result_typecode = (uint8_t)returned_type;

    int result_card = container_get_cardinality(BO, result_typecode);

    assert_int_equal(expected_type, returned_type);

    if (expected_actual_inplace) {
        assert_true(BO == RI);  // it really is inplace
    } else {
        assert_false(BO == RI);  // it better not be inplace
    }

    assert_int_equal(result_size_should_be, result_card);

    for (int x = 0; x < (1 << 16); x++) {
#ifndef UNVERBOSE_MIXED_CONTAINER
        if (container_contains(BO, (uint16_t)x, result_typecode) !=
            result_should_be[x])
            printf("problem at index %d should be (but isnt) %d\n", x,
                   (int)result_should_be[x]);
#endif
        assert_int_equal(container_contains(BO, (uint16_t)x, result_typecode),
                         result_should_be[x]);
    }
    // assert_int_equal(result_size_should_be, result_card);
    container_free(BO, result_typecode);
    if (!inplace) run_container_free(RI);
    // for inplace: input is either output, or it was already freed
    // internally

    return 1;
}